

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddEllipseFilled
          (ImDrawList *this,ImVec2 *center,float radius_x,float radius_y,ImU32 col,int num_segments)

{
  if (2 < num_segments && 0xffffff < col) {
    PathEllipticalArcTo(this,center,radius_x,radius_y,0.0,
                        (((float)num_segments + -1.0) * 6.2831855) / (float)num_segments,
                        num_segments + -1);
    AddConvexPolyFilled(this,(this->_Path).Data,(this->_Path).Size,col);
    (this->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImDrawList::AddEllipseFilled(const ImVec2& center, float radius_x, float radius_y, ImU32 col, int num_segments)
{
    if ((col & IM_COL32_A_MASK) == 0 || num_segments <= 2)
        return;

    // Because we are filling a closed shape we remove 1 from the count of segments/points
    const float a_max = IM_PI * 2.0f * ((float)num_segments - 1.0f) / (float)num_segments;
    PathEllipticalArcTo(center, radius_x, radius_y, 0.0f, a_max, num_segments - 1);
    PathFillConvex(col);
}